

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<signed_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (uint lhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  char cVar1;
  bool bVar2;
  undefined1 *in_RDX;
  undefined1 in_SIL;
  uint in_EDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined1 uVar3;
  
  cVar1 = ::SafeInt::operator_cast_to_signed_char
                    ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT17(in_stack_ffffffffffffffe7,
                              CONCAT16(in_stack_ffffffffffffffe6,
                                       CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                                      )));
  if (cVar1 < '\x01') {
    cVar1 = ::SafeInt::operator_cast_to_signed_char
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT24(in_stack_ffffffffffffffe4,
                                                   in_stack_ffffffffffffffe0))));
    if (cVar1 == '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar2 = DivisionNegativeCornerCaseHelper<signed_char,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase
                      ((uint)in_RDX,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       (char)((ulong)in_RDX >> 0x30),
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (!bVar2) {
      cVar1 = ::SafeInt::operator_cast_to_signed_char
                        ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffe6,
                                                     CONCAT24(in_stack_ffffffffffffffe4,
                                                              in_stack_ffffffffffffffe0))));
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_int>
                ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT24(in_stack_ffffffffffffffe4,
                                                   in_EDI / (uint)(int)cVar1))),
                 (uint *)CONCAT44(in_stack_ffffffffffffffdc,in_EDI));
      *in_RDX = in_stack_ffffffffffffffe6;
    }
  }
  else {
    ::SafeInt::operator_cast_to_signed_char
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))));
    uVar3 = (undefined1)((uint)in_stack_ffffffffffffffec >> 0x18);
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
    SafeInt<unsigned_int>
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))),
               (uint *)CONCAT44(in_EDI,in_stack_ffffffffffffffd8));
    *in_RDX = uVar3;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }